

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O1

char * getalias(char *name)

{
  ident *piVar1;
  string *pacVar2;
  char *local_18;
  stringformatter local_10;
  
  piVar1 = hashset<ident>::access<char_const*>(&idents,&local_18);
  pacVar2 = (string *)0x16d6b4;
  if (((piVar1 != (ident *)0x0) && (piVar1->type == 4)) &&
     ((0x18 < piVar1->index || (((uint)aliasstack->usedargs >> (piVar1->index & 0x1fU) & 1) != 0))))
  {
    switch((piVar1->field_2).minval) {
    case 1:
      retidx = retidx + ((retidx + 1U) / 3) * -3 + 1;
      local_10.buf = retbuf[(uint)retidx];
      stringformatter::operator()(&local_10,"%d",(ulong)*(uint *)&piVar1->field_4);
      pacVar2 = retbuf + (uint)retidx;
      break;
    case 2:
      pacVar2 = (string *)floatstr(*(float *)&piVar1->field_4);
      break;
    case 3:
    case 6:
      pacVar2 = (string *)(piVar1->field_4).args;
    }
  }
  return *pacVar2;
}

Assistant:

const char *getalias(const char *name)
{
    ident *i = idents.access(name);
    return i && i->type==ID_ALIAS && (i->index >= MAXARGS || aliasstack->usedargs&(1<<i->index)) ? i->getstr() : "";
}